

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O2

string * __thiscall
cppcms::encoding::to_utf8_abi_cxx11_
          (string *__return_storage_ptr__,encoding *this,char *c_encoding,char *begin,char *end)

{
  bool bVar1;
  string result;
  allocator local_69;
  _Alloc_hider local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  string local_48 [32];
  
  local_60 = 0;
  local_58 = '\0';
  local_68._M_p = &local_58;
  bVar1 = is_utf8((char *)this);
  if (bVar1) {
    std::__cxx11::string::assign((char *)&local_68,(ulong)c_encoding);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_68._M_p == &local_58) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_57,local_58);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_50;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_57,local_58);
    }
    __return_storage_ptr__->_M_string_length = local_60;
    local_60 = 0;
    local_58 = '\0';
    local_68._M_p = &local_58;
  }
  else {
    std::__cxx11::string::string(local_48,(char *)this,&local_69);
    booster::locale::conv::to_utf<char>
              ((char *)__return_storage_ptr__,c_encoding,(string *)begin,(method_type)local_48);
    std::__cxx11::string::~string(local_48);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string CPPCMS_API to_utf8(char const *c_encoding,char const *begin,char const *end)
{
	std::string result;
	if(is_utf8(c_encoding)) {
		result.assign(begin,end-begin);
		return result;
	}
	return locale::conv::to_utf<char>(begin,end,c_encoding);
}